

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry * NscBuildJsonConstant(char *rawEmbed)

{
  CNscPStackEntry *this;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  if (this->m_nType == NscType_Unknown) {
    this->m_nType = NscType_Engine_7;
    CNscPStackEntry::PushConstantJson(this,rawEmbed,-1);
    return this;
  }
  __assert_fail("m_nType == NscType_Unknown",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0xee,"void CNscPStackEntry::SetType(NscType)");
}

Assistant:

YYSTYPE NscBuildJsonConstant (const char* rawEmbed)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
	pOut ->SetType (NscType_Engine_7);
	pOut ->PushConstantJson(rawEmbed);
	return pOut;
}